

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_prop_down.h
# Opt level: O0

void __thiscall
mp::
ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
::PropagateResult(ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
                  *this,LinearFunctionalConstraint *con,double lb,double ub,Context ctx)

{
  AffineExpr *this_00;
  undefined4 in_EDX;
  LinearFunctionalConstraint *in_RSI;
  double in_RDI;
  LinTerms *unaff_retaddr;
  ConstraintPropagatorsDown<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>_>
  *in_stack_00000008;
  Context in_stack_00000014;
  double in_stack_00000058;
  double in_stack_00000060;
  int in_stack_0000006c;
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  *in_stack_00000070;
  FunctionalConstraint *in_stack_ffffffffffffffa8;
  Context c;
  double ub_00;
  undefined4 in_stack_fffffffffffffff8;
  
  ub_00 = in_RDI;
  FunctionalConstraint::GetResultVar(&in_RSI->super_FunctionalConstraint);
  c.value_ = (CtxVal)((ulong)in_RDI >> 0x20);
  FlatConverter<mp::FlatCvtImpl<mp::MIPFlatConverter,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>,_mip_converter_test::MIPInstanceBackend,_mp::FlatModel<mp::DefaultFlatModelParams>_>
  ::NarrowVarBounds(in_stack_00000070,in_stack_0000006c,in_stack_00000060,in_stack_00000058);
  FunctionalConstraint::AddContext(in_stack_ffffffffffffffa8,c);
  this_00 = LinearFunctionalConstraint::GetAffineExpr(in_RSI);
  BasicFlatConverter::MinusInfty();
  BasicFlatConverter::Infty();
  Context::operator+((Context *)this_00);
  PropagateResult2LinTerms
            (in_stack_00000008,unaff_retaddr,(double)CONCAT44(in_EDX,in_stack_fffffffffffffff8),
             ub_00,in_stack_00000014);
  return;
}

Assistant:

void PropagateResult(LinearFunctionalConstraint& con, double lb, double ub,
                       Context ctx) {
    MPD( NarrowVarBounds(con.GetResultVar(), lb, ub) );
    con.AddContext(ctx);
    PropagateResult2LinTerms(con.GetAffineExpr(),   // @todo better in special cases
                             MPD( MinusInfty() ), MPD( Infty() ), +ctx);
  }